

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BitvecSet(Bitvec *p,u32 i)

{
  anon_union_496_3_7c964c52_for_u *__src;
  u32 uVar1;
  u32 uVar2;
  Bitvec *pBVar3;
  void *__dest;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  if (p == (Bitvec *)0x0) {
    return 0;
  }
  uVar5 = i - 1;
  uVar6 = p->iSize;
  while( true ) {
    if (uVar6 < 0xf81) {
      (p->u).aBitmap[uVar5 >> 3] = (p->u).aBitmap[uVar5 >> 3] | (byte)(1 << ((byte)uVar5 & 7));
      return 0;
    }
    uVar6 = p->iDivisor;
    if (uVar6 == 0) break;
    uVar7 = (ulong)uVar5 / (ulong)uVar6;
    uVar5 = uVar5 % uVar6;
    pBVar3 = *(Bitvec **)((long)&p->u + uVar7 * 8);
    if (pBVar3 == (Bitvec *)0x0) {
      pBVar3 = (Bitvec *)sqlite3Malloc(0x200);
      if (pBVar3 == (Bitvec *)0x0) {
        *(undefined8 *)((long)&p->u + uVar7 * 8) = 0;
        goto LAB_0014a36e;
      }
      memset(&pBVar3->nSet,0,0x1fc);
      pBVar3->iSize = uVar6;
      *(Bitvec **)((long)&p->u + uVar7 * 8) = pBVar3;
    }
    uVar6 = pBVar3->iSize;
    p = pBVar3;
  }
  uVar1 = uVar5 + 1;
  uVar7 = (ulong)(uVar5 % 0x7c);
  __src = &p->u;
  uVar2 = *(u32 *)((long)&p->u + uVar7 * 4);
  if (uVar2 == 0) {
    uVar5 = p->nSet;
    if (uVar5 < 0x7b) {
LAB_0014a2d6:
      p->nSet = uVar5 + 1;
      *(u32 *)((long)&p->u + uVar7 * 4) = uVar1;
      return 0;
    }
  }
  else {
    do {
      if (uVar2 == uVar1) {
        return 0;
      }
      uVar6 = (int)uVar7 + 1;
      if (0x7b < uVar6) {
        uVar6 = 0;
      }
      uVar7 = (ulong)uVar6;
      uVar2 = __src->aHash[uVar7];
    } while (uVar2 != 0);
    uVar5 = p->nSet;
    if (uVar5 < 0x3e) {
      uVar7 = (ulong)uVar6;
      goto LAB_0014a2d6;
    }
  }
  __dest = sqlite3Malloc(0x1f0);
  if (__dest == (void *)0x0) {
LAB_0014a36e:
    uVar6 = 7;
  }
  else {
    memcpy(__dest,__src,0x1f0);
    lVar4 = 0;
    memset(__src,0,0x1f0);
    p->iDivisor = (u32)(((ulong)p->iSize + 0x3d) / 0x3e);
    uVar6 = sqlite3BitvecSet(p,uVar1);
    do {
      uVar1 = *(u32 *)((long)__dest + lVar4 * 4);
      if (uVar1 != 0) {
        uVar5 = sqlite3BitvecSet(p,uVar1);
        uVar6 = uVar6 | uVar5;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x7c);
    sqlite3_free(__dest);
  }
  return uVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3BitvecSet(Bitvec *p, u32 i){
  u32 h;
  if( p==0 ) return SQLITE_OK;
  assert( i>0 );
  assert( i<=p->iSize );
  i--;
  while((p->iSize > BITVEC_NBIT) && p->iDivisor) {
    u32 bin = i/p->iDivisor;
    i = i%p->iDivisor;
    if( p->u.apSub[bin]==0 ){
      p->u.apSub[bin] = sqlite3BitvecCreate( p->iDivisor );
      if( p->u.apSub[bin]==0 ) return SQLITE_NOMEM_BKPT;
    }
    p = p->u.apSub[bin];
  }
  if( p->iSize<=BITVEC_NBIT ){
    p->u.aBitmap[i/BITVEC_SZELEM] |= 1 << (i&(BITVEC_SZELEM-1));
    return SQLITE_OK;
  }
  h = BITVEC_HASH(i++);
  /* if there wasn't a hash collision, and this doesn't */
  /* completely fill the hash, then just add it without */
  /* worring about sub-dividing and re-hashing. */
  if( !p->u.aHash[h] ){
    if (p->nSet<(BITVEC_NINT-1)) {
      goto bitvec_set_end;
    } else {
      goto bitvec_set_rehash;
    }
  }
  /* there was a collision, check to see if it's already */
  /* in hash, if not, try to find a spot for it */
  do {
    if( p->u.aHash[h]==i ) return SQLITE_OK;
    h++;
    if( h>=BITVEC_NINT ) h = 0;
  } while( p->u.aHash[h] );
  /* we didn't find it in the hash.  h points to the first */
  /* available free spot. check to see if this is going to */
  /* make our hash too "full".  */
bitvec_set_rehash:
  if( p->nSet>=BITVEC_MXHASH ){
    unsigned int j;
    int rc;
    u32 *aiValues = sqlite3StackAllocRaw(0, sizeof(p->u.aHash));
    if( aiValues==0 ){
      return SQLITE_NOMEM_BKPT;
    }else{
      memcpy(aiValues, p->u.aHash, sizeof(p->u.aHash));
      memset(p->u.apSub, 0, sizeof(p->u.apSub));
      p->iDivisor = (p->iSize + BITVEC_NPTR - 1)/BITVEC_NPTR;
      rc = sqlite3BitvecSet(p, i);
      for(j=0; j<BITVEC_NINT; j++){
        if( aiValues[j] ) rc |= sqlite3BitvecSet(p, aiValues[j]);
      }
      sqlite3StackFree(0, aiValues);
      return rc;
    }
  }
bitvec_set_end:
  p->nSet++;
  p->u.aHash[h] = i;
  return SQLITE_OK;
}